

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O2

void __thiscall
SplitCompilationTest_random_vector_Test<signed_char>::TestBody
          (SplitCompilationTest_random_vector_Test<signed_char> *this)

{
  AssertHelper aAStack_b8 [8];
  long *local_b0;
  vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  empty;
  container_type_conflict50 split_result;
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  local_70;
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  delim;
  AssertionResult local_40 [2];
  AssertionResult gtest_ar_;
  
  empty.
  super__Vector_base<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.
  super__Vector_base<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.
  super__Vector_base<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  delim.
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  delim.
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  delim.
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::vector(&local_70,&delim);
  jessilib::
  split<std::vector,_std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>_>
            (&split_result,&empty,&local_70);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_70);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       split_result.
       super__Vector_base<std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       split_result.
       super__Vector_base<std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_40,&gtest_ar_.success_,"split_result.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x6d,(char *)local_40[0]._0_8_);
    testing::internal::AssertHelper::operator=(aAStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_b8);
    std::__cxx11::string::~string((string *)local_40);
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::
  vector<std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>_>_>
  ::~vector(&split_result);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&delim);
  std::
  vector<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::~vector(&empty);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_list_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::list>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::list>(empty, delim, 5).empty());
}